

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

bool Assimp::IFC::ProcessPolyloop(IfcPolyLoop *loop,TempMesh *meshout,ConversionData *param_3)

{
  pointer *ppaVar1;
  uint uVar2;
  undefined8 *puVar3;
  iterator __position;
  pointer puVar4;
  ulong uVar5;
  IfcCartesianPoint *in;
  int iVar6;
  undefined8 *puVar7;
  IfcVector3 tmp;
  IfcVector3 local_48;
  
  puVar3 = *(undefined8 **)&loop->field_0x48;
  iVar6 = 0;
  for (puVar7 = *(undefined8 **)&(loop->super_IfcLoop).field_0x40; puVar7 != puVar3;
      puVar7 = puVar7 + 1) {
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>((LazyObject *)*puVar7);
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    ConvertCartesianPoint(&local_48,in);
    __position._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>const&>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,__position
                 ,&local_48);
    }
    else {
      (__position._M_current)->z = local_48.z;
      (__position._M_current)->x = local_48.x;
      (__position._M_current)->y = local_48.y;
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  uVar5 = (ulong)local_48.x >> 0x20;
  local_48.x = (double)CONCAT44((int)uVar5,iVar6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&meshout->mVertcnt,(uint *)&local_48);
  puVar4 = (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = puVar4[-1];
  if (uVar2 == 1) {
    (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + -1;
    ppaVar1 = &(meshout->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + -1;
  }
  return 1 < uVar2;
}

Assistant:

bool ProcessPolyloop(const Schema_2x3::IfcPolyLoop& loop, TempMesh& meshout, ConversionData& /*conv*/)
{
    size_t cnt = 0;
    for(const Schema_2x3::IfcCartesianPoint& c : loop.Polygon) {
        IfcVector3 tmp;
        ConvertCartesianPoint(tmp,c);

        meshout.mVerts.push_back(tmp);
        ++cnt;
    }

    meshout.mVertcnt.push_back(static_cast<unsigned int>(cnt));

    // zero- or one- vertex polyloops simply ignored
    if (meshout.mVertcnt.back() > 1) {
        return true;
    }

    if (meshout.mVertcnt.back()==1) {
        meshout.mVertcnt.pop_back();
        meshout.mVerts.pop_back();
    }
    return false;
}